

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O3

void __thiscall leveldb::MemEnvTest_DBTest_Test::TestBody(MemEnvTest_DBTest_Test *this)

{
  AssertHelper *pAVar1;
  size_type sVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  long *plVar6;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  _Alloc_hider _Var8;
  AssertionResult *this_00;
  char *pcVar9;
  char *in_R9;
  long lVar10;
  undefined1 auVar11 [16];
  string res;
  DB *db;
  Slice vals [3];
  Slice keys [3];
  Options options;
  AssertionResult local_160;
  AssertHelper local_150;
  string local_148;
  undefined1 local_128 [120];
  size_t local_b0;
  char *local_a8;
  FilterPolicy *local_a0;
  undefined1 local_90 [96];
  undefined4 extraout_var;
  
  Options::Options((Options *)local_90);
  local_90[8] = true;
  local_90._16_8_ = (this->super_MemEnvTest).env_;
  local_128._96_8_ = "aaa";
  local_128._104_8_ = 3;
  local_128._112_8_ = "bbb";
  local_b0 = 3;
  local_a8 = "ccc";
  local_a0 = (FilterPolicy *)0x3;
  local_128._48_8_ = "foo";
  local_128[0x38] = true;
  local_128[0x39] = false;
  local_128[0x3a] = false;
  local_128._59_5_ = 0;
  local_128._64_8_ = "bar";
  local_128._72_8_ = (Logger *)0x3;
  local_128._80_8_ = "baz";
  local_128._88_8_ = 3;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"/dir/db","");
  DB::Open((DB *)&local_160,(Options *)local_90,&local_148,(DB **)(local_128 + 0x20));
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_128,
             (char *)&local_150,(Status *)"DB::Open(options, \"/dir/db\", &db)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__((void *)local_160._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  uVar3 = local_128._8_8_;
  if (local_128[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_148);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_128._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_128._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,0xe1,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    _Var8._M_p = local_148._M_dataplus._M_p;
LAB_0010f887:
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_Var8._M_p + 8))();
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_;
    }
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._8_8_)->_M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_128._8_8_ + 0x10)) {
        operator_delete((undefined1 *)
                        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_128._8_8_)->_M_allocated_capacity);
      }
      operator_delete((void *)uVar3);
    }
    lVar10 = 0;
    do {
      local_150.data_._0_1_ = 0;
      (**(code **)(*(_func_int **)local_128._32_8_ + 0x10))
                (local_128,local_128._32_8_,&local_150,local_128 + lVar10 + 0x60,
                 local_128 + lVar10 + 0x30);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_148,
                 &local_160.success_,(Status *)"db->Put(WriteOptions(), keys[i], vals[i])");
      if ((void *)CONCAT71(local_128._1_7_,local_128[0]) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_128._1_7_,local_128[0]));
      }
      sVar2 = local_148._M_string_length;
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)local_128);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_148._M_string_length ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_148._M_string_length)->_M_allocated_capacity;
        }
        iVar5 = 0xe3;
        goto LAB_0010f8b9;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_148._M_string_length !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_string_length)->_M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_148._M_string_length + 0x10)) {
          operator_delete((undefined1 *)
                          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_148._M_string_length)->_M_allocated_capacity);
        }
        operator_delete((void *)sVar2);
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x30);
    lVar10 = 0;
    do {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      local_148._M_string_length = 0;
      local_148.field_2._M_local_buf[0] = '\0';
      local_160.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      local_160._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x100;
      (**(code **)(*(_func_int **)local_128._32_8_ + 0x28))
                (&local_150,local_128._32_8_,&local_160,local_128 + lVar10 + 0x60,&local_148);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_128,
                 local_128 + 0x28,(Status *)"db->Get(ReadOptions(), keys[i], &res)");
      if ((void *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_));
      }
      uVar3 = local_128._8_8_;
      if (local_128[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        testing::Message::Message((Message *)&local_160);
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_128._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = *(char **)local_128._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xe8,pcVar9);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        _Var7._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(_func_int **)local_160._0_8_ + 8))();
          _Var7._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_;
        }
LAB_0010fa28:
        if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )_Var7._M_head_impl !=
            (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(_Var7._M_head_impl)->_M_dataplus)->_M_allocated_capacity !=
              &(_Var7._M_head_impl)->field_2) {
            operator_delete((undefined1 *)
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)&(_Var7._M_head_impl)->_M_dataplus)->_M_allocated_capacity);
          }
          operator_delete(_Var7._M_head_impl);
        }
        goto LAB_0010fa46;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._8_8_)->_M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_128._8_8_ + 0x10)) {
          operator_delete((undefined1 *)
                          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_128._8_8_)->_M_allocated_capacity);
        }
        operator_delete((void *)uVar3);
      }
      _Var8._M_p = local_148._M_dataplus._M_p;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_148._M_string_length !=
          *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (local_128 + lVar10 + 0x38)) {
        local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
LAB_0010f947:
        local_160.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        testing::Message::Message((Message *)&local_150);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_128,(internal *)&local_160,(AssertionResult *)"res == vals[i]",
                   "false","true",in_R9);
        pAVar1 = (AssertHelper *)(local_128 + 0x28);
        testing::internal::AssertHelper::AssertHelper
                  (pAVar1,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0xe9,(char *)CONCAT71(local_128._1_7_,local_128[0]));
        testing::internal::AssertHelper::operator=(pAVar1,(Message *)&local_150);
        testing::internal::AssertHelper::~AssertHelper(pAVar1);
        if ((undefined1 *)CONCAT71(local_128._1_7_,local_128[0]) != local_128 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_128._1_7_,local_128[0]));
        }
        _Var7._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_160.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
          _Var7._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_160.message_;
        }
        goto LAB_0010fa28;
      }
      iVar5 = bcmp(local_148._M_dataplus._M_p,*(void **)(local_128 + lVar10 + 0x30),
                   local_148._M_string_length);
      local_160.success_ = iVar5 == 0;
      local_160.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar5 != 0) goto LAB_0010f947;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != &local_148.field_2) {
        operator_delete(_Var8._M_p);
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x30);
    local_148._M_string_length = 0;
    local_148._M_dataplus._M_p = (pointer)0x100;
    iVar5 = (**(code **)(*(_func_int **)local_128._32_8_ + 0x30))();
    plVar6 = (long *)CONCAT44(extraout_var,iVar5);
    (**(code **)(*plVar6 + 0x18))(plVar6);
    lVar10 = 8;
    do {
      local_128[0] = (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)
                     (**(code **)(*plVar6 + 0x10))(plVar6);
      local_128._8_8_ =
           (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
      if (local_128[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        testing::Message::Message((Message *)&local_160);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)local_128,(AssertionResult *)0x157a41,"false","true",in_R9
                  );
        iVar5 = 0xef;
        goto LAB_0010fb71;
      }
      auVar11 = (**(code **)(*plVar6 + 0x40))(plVar6);
      if (*(size_t *)(local_128 + lVar10 + 0x60) != auVar11._8_8_) {
        local_128[0] = (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0;
LAB_0010fac1:
        local_128._8_8_ =
             (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
        testing::Message::Message((Message *)&local_160);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)local_128,(AssertionResult *)"keys[i] == iterator->key()",
                   "false","true",in_R9);
        iVar5 = 0xf0;
        goto LAB_0010fb71;
      }
      iVar5 = bcmp(*(void **)(local_128 + lVar10 + 0x58),auVar11._0_8_,auVar11._8_8_);
      local_128[0] = (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)(iVar5 == 0);
      local_128._8_8_ =
           (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
      if (!(bool)local_128[0]) goto LAB_0010fac1;
      auVar11 = (**(code **)(*plVar6 + 0x48))(plVar6);
      if (*(size_t *)(local_128 + lVar10 + 0x30) != auVar11._8_8_) {
        local_128[0] = (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0;
LAB_0010fb21:
        local_128._8_8_ =
             (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
        testing::Message::Message((Message *)&local_160);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_148,(internal *)local_128,
                   (AssertionResult *)"vals[i] == iterator->value()","false","true",in_R9);
        iVar5 = 0xf1;
        goto LAB_0010fb71;
      }
      iVar5 = bcmp(*(void **)(local_128 + lVar10 + 0x28),auVar11._0_8_,auVar11._8_8_);
      local_128[0] = (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)(iVar5 == 0);
      local_128._8_8_ =
           (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
      if (!(bool)local_128[0]) goto LAB_0010fb21;
      (**(code **)(*plVar6 + 0x30))(plVar6);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x38);
    bVar4 = (**(code **)(*plVar6 + 0x10))(plVar6);
    local_128[0] = (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)(bVar4 ^ 1);
    local_128._8_8_ =
         (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
    if (local_128[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_148,(internal *)local_128,(AssertionResult *)"!iterator->Valid()","false",
                 "true",in_R9);
      iVar5 = 0xf4;
LAB_0010fb71:
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,iVar5,local_148._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      _Var8._M_p = (pointer)local_160._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
        _Var8._M_p = (pointer)local_160._0_8_;
      }
      goto LAB_0010f887;
    }
    (**(code **)(*plVar6 + 8))(plVar6);
    DBImpl::TEST_CompactMemTable((DBImpl *)local_128);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_148,
               &local_160.success_,(Status *)"dbi->TEST_CompactMemTable()");
    if ((void *)CONCAT71(local_128._1_7_,local_128[0]) != (void *)0x0) {
      operator_delete__((void *)CONCAT71(local_128._1_7_,local_128[0]));
    }
    sVar2 = local_148._M_string_length;
    if ((char)local_148._M_dataplus._M_p != '\0') {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_148._M_string_length !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_string_length)->_M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_148._M_string_length + 0x10)) {
          operator_delete((undefined1 *)
                          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_148._M_string_length)->_M_allocated_capacity);
        }
        operator_delete((void *)sVar2);
      }
      lVar10 = 0;
      while( true ) {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        local_148._M_string_length = 0;
        local_148.field_2._M_local_buf[0] = '\0';
        local_160.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        local_160._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x100;
        (**(code **)(*(_func_int **)local_128._32_8_ + 0x28))
                  (&local_150,local_128._32_8_,&local_160,local_128 + lVar10 + 0x60,&local_148);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_128,
                   local_128 + 0x28,(Status *)"db->Get(ReadOptions(), keys[i], &res)");
        if ((void *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (void *)0x0) {
          operator_delete__((void *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_));
        }
        uVar3 = local_128._8_8_;
        if (local_128[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) break;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._8_8_)->_M_allocated_capacity !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_128._8_8_ + 0x10)) {
            operator_delete((undefined1 *)
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_128._8_8_)->_M_allocated_capacity);
          }
          operator_delete((void *)uVar3);
        }
        _Var8._M_p = local_148._M_dataplus._M_p;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_148._M_string_length !=
            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (local_128 + lVar10 + 0x38)) {
          local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
LAB_0010fd9d:
          local_160.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          testing::Message::Message((Message *)&local_150);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_128,(internal *)&local_160,(AssertionResult *)"res == vals[i]",
                     "false","true",in_R9);
          pAVar1 = (AssertHelper *)(local_128 + 0x28);
          testing::internal::AssertHelper::AssertHelper
                    (pAVar1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                     ,0xfd,(char *)CONCAT71(local_128._1_7_,local_128[0]));
          testing::internal::AssertHelper::operator=(pAVar1,(Message *)&local_150);
          testing::internal::AssertHelper::~AssertHelper(pAVar1);
          if ((undefined1 *)CONCAT71(local_128._1_7_,local_128[0]) != local_128 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_128._1_7_,local_128[0]));
          }
          if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
          }
          this_00 = &local_160;
          goto LAB_0010fe7e;
        }
        iVar5 = bcmp(local_148._M_dataplus._M_p,*(void **)(local_128 + lVar10 + 0x30),
                     local_148._M_string_length);
        local_160.success_ = iVar5 == 0;
        local_160.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (iVar5 != 0) goto LAB_0010fd9d;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var8._M_p != &local_148.field_2) {
          operator_delete(_Var8._M_p);
        }
        lVar10 = lVar10 + 0x10;
        if (lVar10 == 0x30) {
          if ((_func_int **)local_128._32_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_128._32_8_ + 8))();
            return;
          }
          return;
        }
      }
      testing::Message::Message((Message *)&local_160);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)local_128._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,0xfc,pcVar9);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(_func_int **)local_160._0_8_ + 8))();
      }
      this_00 = (AssertionResult *)local_128;
LAB_0010fe7e:
      testing::AssertionResult::~AssertionResult(this_00);
LAB_0010fa46:
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_148._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p == &local_148.field_2) {
        return;
      }
      goto LAB_0010f902;
    }
    testing::Message::Message((Message *)local_128);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_148._M_string_length ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_string_length)->_M_allocated_capacity;
    }
    iVar5 = 0xf8;
LAB_0010f8b9:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,iVar5,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_148._M_string_length;
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_148._M_string_length;
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Var7._M_head_impl ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&(_Var7._M_head_impl)->_M_dataplus)->_M_allocated_capacity !=
      &(_Var7._M_head_impl)->field_2) {
    operator_delete((undefined1 *)
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&(_Var7._M_head_impl)->_M_dataplus)->_M_allocated_capacity);
  }
LAB_0010f902:
  operator_delete(_Var7._M_head_impl);
  return;
}

Assistant:

TEST_F(MemEnvTest, DBTest) {
  Options options;
  options.create_if_missing = true;
  options.env = env_;
  DB* db;

  const Slice keys[] = {Slice("aaa"), Slice("bbb"), Slice("ccc")};
  const Slice vals[] = {Slice("foo"), Slice("bar"), Slice("baz")};

  ASSERT_LEVELDB_OK(DB::Open(options, "/dir/db", &db));
  for (size_t i = 0; i < 3; ++i) {
    ASSERT_LEVELDB_OK(db->Put(WriteOptions(), keys[i], vals[i]));
  }

  for (size_t i = 0; i < 3; ++i) {
    std::string res;
    ASSERT_LEVELDB_OK(db->Get(ReadOptions(), keys[i], &res));
    ASSERT_TRUE(res == vals[i]);
  }

  Iterator* iterator = db->NewIterator(ReadOptions());
  iterator->SeekToFirst();
  for (size_t i = 0; i < 3; ++i) {
    ASSERT_TRUE(iterator->Valid());
    ASSERT_TRUE(keys[i] == iterator->key());
    ASSERT_TRUE(vals[i] == iterator->value());
    iterator->Next();
  }
  ASSERT_TRUE(!iterator->Valid());
  delete iterator;

  DBImpl* dbi = reinterpret_cast<DBImpl*>(db);
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  for (size_t i = 0; i < 3; ++i) {
    std::string res;
    ASSERT_LEVELDB_OK(db->Get(ReadOptions(), keys[i], &res));
    ASSERT_TRUE(res == vals[i]);
  }

  delete db;
}